

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeating_task.cc
# Opt level: O1

bool __thiscall dd::RepeatingTaskBase::Run(RepeatingTaskBase *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  long lVar3;
  bool bVar4;
  RepeatingTaskBase *local_20;
  
  bVar4 = true;
  if (this->_next_run_time != 0x7fffffffffffffff) {
    iVar1 = (*(this->super_QueuedTask)._vptr_QueuedTask[3])();
    bVar4 = this->_next_run_time == 0x7fffffffffffffff;
    if (!bVar4) {
      lVar2 = std::chrono::_V2::system_clock::now();
      lVar3 = SUB168(SEXT816(lVar2) * SEXT816(-0x431bde82d7b634db),8);
      lVar2 = CONCAT44(extraout_var,iVar1) + this->_next_run_time;
      this->_next_run_time = lVar2;
      lVar2 = ((lVar3 >> 0x12) - (lVar3 >> 0x3f)) + lVar2;
      if (lVar2 < 1) {
        lVar2 = 0;
      }
      local_20 = this;
      (*this->_task_queue->_vptr_TaskQueueBase[2])(this->_task_queue,&local_20,lVar2);
      if (local_20 != (RepeatingTaskBase *)0x0) {
        (*(local_20->super_QueuedTask)._vptr_QueuedTask[1])();
      }
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool RepeatingTaskBase::Run() {
		if (IsPlusInfinity(_next_run_time))
			return true;
		auto delay = RunClosure();
		if (IsPlusInfinity(_next_run_time))
			return true;

		uint64_t lost_time = GetCurrentTick() - _next_run_time;
		_next_run_time += delay;
		delay -= lost_time;
		delay = delay > 0 ? delay : 0;// (std::max)(delay, 0);
		_task_queue->PostDelayedTask(std::unique_ptr<RepeatingTaskBase>(this), delay);
		return false;
	}